

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O3

void __thiscall Memory::LargeHeapBlock::FinalizeObjects(LargeHeapBlock *this,Recycler *recycler)

{
  code *pcVar1;
  bool bVar2;
  uchar uVar3;
  undefined4 *puVar4;
  LargeObjectHeader *this_00;
  Recycler *recycler_00;
  uint index;
  
  if (this->lastCollectAllocCount != 0) {
    index = 0;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      this_00 = GetHeaderByIndex(this,index);
      if (this_00 != (LargeObjectHeader *)0x0) {
        if (index != this_00->objectIndex) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                             ,0x797,"(header->objectIndex == i)","header->objectIndex == i");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar4 = 0;
        }
        recycler_00 = (Recycler *)(this_00 + 1);
        bVar2 = HeapBlockMap64::IsMarked(&recycler->heapBlockMap,recycler_00);
        if (!bVar2) {
          uVar3 = LargeObjectHeader::GetAttributes(this_00,this->heapInfo->recycler->Cookie);
          if ((char)uVar3 < '\0') {
            Recycler::NotifyFree(recycler,(char *)recycler_00,this_00->objectSize);
            FinalizeObject(this,recycler_00,this_00);
          }
        }
      }
      index = index + 1;
    } while (index < this->lastCollectAllocCount);
  }
  return;
}

Assistant:

void LargeHeapBlock::FinalizeObjects(Recycler* recycler)
{
    const HeapBlockMap& heapBlockMap = recycler->heapBlockMap;

    for (uint i = 0; i < this->lastCollectAllocCount; i++)
    {
        LargeObjectHeader * header = this->GetHeaderByIndex(i);
        if (header == nullptr)
        {
            continue;
        }

        Assert(header->objectIndex == i);

        // Skip finalization if the object is alive
        if (heapBlockMap.IsMarked(header->GetAddress()))
        {
            continue;
        }

        if ((header->GetAttributes(this->heapInfo->recycler->Cookie) & FinalizeBit) == FinalizeBit)
        {
            recycler->NotifyFree((char *)header->GetAddress(), header->objectSize);
            FinalizeObject(recycler, header);
        }
    }
}